

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::CodedStreamTest_InputOver2G_Test::
~CodedStreamTest_InputOver2G_Test(CodedStreamTest_InputOver2G_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(CodedStreamTest, InputOver2G) {
  // CodedInputStream should gracefully handle input over 2G and call
  // input.BackUp() with the correct number of bytes on destruction.
  ReallyBigInputStream input;

  {
    absl::ScopedMockLog log(absl::MockLogDefault::kDisallowUnexpected);
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_, testing::_))
        .Times(0);
    log.StartCapturingLogs();
    CodedInputStream coded_input(&input);
    std::string str;
    EXPECT_TRUE(coded_input.ReadString(&str, 512));
    EXPECT_TRUE(coded_input.ReadString(&str, 1024));
  }

  EXPECT_EQ(INT_MAX - 512, input.backup_amount_);
}